

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_struct_declaration
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,bool is_exception,bool pointers,
          bool read,bool write,bool swap,bool is_user_struct)

{
  int *piVar1;
  pointer pptVar2;
  string name;
  bool bVar3;
  char cVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  t_type *ptVar10;
  undefined4 extraout_var_11;
  t_const_value *ptVar11;
  iterator iVar12;
  undefined4 extraout_var_12;
  ostream *poVar13;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  t_cpp_generator *ptVar14;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined7 in_register_00000009;
  pointer pptVar15;
  t_field *ptVar16;
  char *pcVar17;
  string *this_00;
  pointer pptVar18;
  t_cpp_generator *ptVar19;
  char *pcVar20;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  t_struct *ptVar21;
  string isSet;
  string args_indent;
  string dval;
  string extends;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&extends,"",(allocator *)&isSet);
  if (((int)CONCAT71(in_register_00000009,is_exception) != 0) ||
     ((is_user_struct && (this->gen_templates_ == false)))) {
    std::__cxx11::string::assign((char *)&extends);
  }
  bVar5 = 0;
  for (pptVar15 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      pptVar15 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar15 = pptVar15 + 1) {
    bVar5 = bVar5 | (*pptVar15)->req_ != T_REQUIRED;
  }
  bVar6 = (bool)((!pointers || read) & bVar5);
  poVar9 = out;
  ptVar19 = this;
  ptVar21 = tstruct;
  if (bVar6) {
    t_generator::indent_abi_cxx11_(&isSet,(t_generator *)this);
    poVar8 = std::operator<<(out,(string *)&isSet);
    poVar8 = std::operator<<(poVar8,"typedef struct _");
    iVar7 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar8 = std::operator<<(poVar8,(string *)CONCAT44(extraout_var,iVar7));
    poVar8 = std::operator<<(poVar8,"__isset {");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&isSet);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar8 = t_generator::indent((t_generator *)this,out);
    poVar8 = std::operator<<(poVar8,"_");
    iVar7 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar8 = std::operator<<(poVar8,(string *)CONCAT44(extraout_var_00,iVar7));
    std::operator<<(poVar8,"__isset() ");
    bVar3 = true;
    pptVar15 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    out = poVar9;
    this = ptVar19;
    tstruct = ptVar21;
    for (; pptVar15 !=
           (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
           super__Vector_impl_data._M_finish; pptVar15 = pptVar15 + 1) {
      if ((*pptVar15)->req_ != T_REQUIRED) {
        pcVar17 = "true";
        if ((*pptVar15)->value_ == (t_const_value *)0x0) {
          pcVar17 = "false";
        }
        std::__cxx11::string::string((string *)&isSet,pcVar17,(allocator *)&args_indent);
        pcVar17 = ", ";
        if (bVar3) {
          pcVar17 = ": ";
        }
        poVar9 = std::operator<<(out,pcVar17);
        poVar9 = std::operator<<(poVar9,(string *)&(*pptVar15)->name_);
        poVar9 = std::operator<<(poVar9,"(");
        poVar9 = std::operator<<(poVar9,(string *)&isSet);
        std::operator<<(poVar9,")");
        std::__cxx11::string::~string((string *)&isSet);
        bVar3 = false;
      }
    }
    poVar9 = std::operator<<(out," {}");
    ptVar21 = tstruct;
    std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    for (pptVar15 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        pptVar15 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar15 = pptVar15 + 1) {
      if ((*pptVar15)->req_ != T_REQUIRED) {
        poVar9 = t_generator::indent((t_generator *)this,out);
        poVar9 = std::operator<<(poVar9,"bool ");
        poVar9 = std::operator<<(poVar9,(string *)&(*pptVar15)->name_);
        poVar9 = std::operator<<(poVar9," :1;");
        std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
      }
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar9 = out;
    ptVar19 = this;
    poVar8 = t_generator::indent((t_generator *)this,out);
    poVar8 = std::operator<<(poVar8,"} _");
    iVar7 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar8 = std::operator<<(poVar8,(string *)CONCAT44(extraout_var_01,iVar7));
    poVar8 = std::operator<<(poVar8,"__isset;");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x22])(this,out,tstruct);
  t_generator::indent_abi_cxx11_(&isSet,(t_generator *)this);
  poVar8 = std::operator<<(out,(string *)&isSet);
  poVar8 = std::operator<<(poVar8,"class ");
  iVar7 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar8 = std::operator<<(poVar8,(string *)CONCAT44(extraout_var_02,iVar7));
  poVar8 = std::operator<<(poVar8,(string *)&extends);
  poVar8 = std::operator<<(poVar8," {");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&args_indent,(t_generator *)this);
  poVar8 = std::operator<<(poVar8,(string *)&args_indent);
  poVar8 = std::operator<<(poVar8," public:");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&args_indent);
  ptVar14 = (t_cpp_generator *)&isSet;
  std::__cxx11::string::~string((string *)ptVar14);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  if (!pointers) {
    bVar3 = is_struct_storage_not_throwing(ptVar14,tstruct);
    poVar8 = t_generator::indent((t_generator *)ptVar19,poVar9);
    iVar7 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar8 = std::operator<<(poVar8,(string *)CONCAT44(extraout_var_03,iVar7));
    poVar8 = std::operator<<(poVar8,"(const ");
    iVar7 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar8 = std::operator<<(poVar8,(string *)CONCAT44(extraout_var_04,iVar7));
    poVar8 = std::operator<<(poVar8,"&)");
    pcVar17 = " noexcept";
    pcVar20 = "";
    if (bVar3) {
      pcVar20 = " noexcept";
    }
    poVar8 = std::operator<<(poVar8,pcVar20);
    poVar8 = std::operator<<(poVar8,';');
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    if (ptVar19->gen_moveable_ == true) {
      poVar8 = t_generator::indent((t_generator *)ptVar19,poVar9);
      iVar7 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      poVar8 = std::operator<<(poVar8,(string *)CONCAT44(extraout_var_05,iVar7));
      poVar8 = std::operator<<(poVar8,"(");
      iVar7 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      poVar8 = std::operator<<(poVar8,(string *)CONCAT44(extraout_var_06,iVar7));
      poVar8 = std::operator<<(poVar8,"&&) noexcept;");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    }
    poVar8 = t_generator::indent((t_generator *)ptVar19,poVar9);
    iVar7 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar8 = std::operator<<(poVar8,(string *)CONCAT44(extraout_var_07,iVar7));
    poVar8 = std::operator<<(poVar8,"& operator=(const ");
    iVar7 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar8 = std::operator<<(poVar8,(string *)CONCAT44(extraout_var_08,iVar7));
    poVar8 = std::operator<<(poVar8,"&)");
    poVar8 = std::operator<<(poVar8,pcVar20);
    poVar8 = std::operator<<(poVar8,';');
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    if (ptVar19->gen_moveable_ == true) {
      poVar8 = t_generator::indent((t_generator *)ptVar19,poVar9);
      iVar7 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      poVar8 = std::operator<<(poVar8,(string *)CONCAT44(extraout_var_09,iVar7));
      poVar8 = std::operator<<(poVar8,"& operator=(");
      iVar7 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      poVar8 = std::operator<<(poVar8,(string *)CONCAT44(extraout_var_10,iVar7));
      poVar8 = std::operator<<(poVar8,"&&) noexcept;");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    }
    this = ptVar19;
    for (pptVar15 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        pptVar2 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish, pptVar15 != pptVar2;
        pptVar15 = pptVar15 + 1) {
      ptVar10 = t_type::get_true_type((*pptVar15)->type_);
      ptVar16 = *pptVar15;
      if (ptVar16->reference_ == false) {
        iVar7 = (*(ptVar10->super_t_doc)._vptr_t_doc[6])(ptVar10);
        if ((char)iVar7 != '\0') {
          ptVar16 = *pptVar15;
          goto LAB_0016e46c;
        }
      }
      else {
LAB_0016e46c:
        if (ptVar16->value_ != (t_const_value *)0x0) break;
      }
    }
    iVar7 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    std::operator+(&isSet,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(extraout_var_11,iVar7),"()");
    poVar8 = t_generator::indent((t_generator *)ptVar19,poVar9);
    poVar8 = std::operator<<(poVar8,(string *)&isSet);
    if (pptVar15 != pptVar2) {
      pcVar17 = "";
    }
    std::operator<<(poVar8,pcVar17);
    t_generator::indent_abi_cxx11_(&dval,(t_generator *)ptVar19);
    args_indent._M_dataplus._M_p = (pointer)&args_indent.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&args_indent,
               (char)isSet._M_string_length +
               (pptVar15 != pptVar2) * '\x04' + (char)dval._M_string_length + -1);
    std::__cxx11::string::~string((string *)&dval);
    bVar3 = false;
    pptVar18 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ptVar10 = (t_type *)isSet._M_string_length;
    tstruct = ptVar21;
    for (; pptVar18 !=
           (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
           super__Vector_impl_data._M_finish; pptVar18 = pptVar18 + 1) {
      ptVar11 = (t_const_value *)t_type::get_true_type((*pptVar18)->type_);
      cVar4 = (**(code **)(*(long *)&(ptVar11->mapVal_)._M_t._M_impl + 0x28))(ptVar11);
      if (((cVar4 != '\0') ||
          (cVar4 = (**(code **)(*(long *)&(ptVar11->mapVal_)._M_t._M_impl + 0x50))(ptVar11),
          cVar4 != '\0')) || ((*pptVar18)->reference_ == true)) {
        dval._M_dataplus._M_p = (pointer)&dval.field_2;
        dval._M_string_length = 0;
        dval.field_2._M_local_buf[0] = '\0';
        if ((*pptVar18)->value_ == (t_const_value *)0x0) {
          cVar4 = (**(code **)(*(long *)&(ptVar11->mapVal_)._M_t._M_impl + 0x50))(ptVar11);
          if (cVar4 != '\0') {
            ptVar10 = (t_type *)0x0;
            type_name_abi_cxx11_(&local_50,this,(t_type *)ptVar11,false,false);
            std::operator+(&local_b0,"static_cast<",&local_50);
            std::operator+(&local_d0,&local_b0,">(0)");
            std::__cxx11::string::append((string *)&dval);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_b0);
            this_00 = &local_50;
            goto LAB_0016e68d;
          }
          (**(code **)(*(long *)&(ptVar11->mapVal_)._M_t._M_impl + 0x30))(ptVar11);
          std::__cxx11::string::append((char *)&dval);
        }
        else {
          std::__cxx11::string::string((string *)&local_90,(string *)&(*pptVar18)->name_);
          name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe6c;
          name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe68;
          name._M_string_length = (size_type)poVar9;
          name.field_2._M_allocated_capacity = (size_type)this;
          name.field_2._8_8_ = tstruct;
          render_const_value(&local_d0,this,poVar9,name,ptVar10,ptVar11);
          std::__cxx11::string::append((string *)&dval);
          std::__cxx11::string::~string((string *)&local_d0);
          this_00 = &local_90;
LAB_0016e68d:
          std::__cxx11::string::~string((string *)this_00);
        }
        if (bVar3) {
          poVar8 = std::operator<<(poVar9,",\n");
          std::operator<<(poVar8,(string *)&args_indent);
        }
        else if (pptVar15 == pptVar2) {
          poVar8 = std::operator<<(poVar9,'\n');
          poVar8 = std::operator<<(poVar8,(string *)&args_indent);
          std::operator<<(poVar8,": ");
          std::__cxx11::string::append((char *)&args_indent);
        }
        else {
          std::operator<<(poVar9," : ");
        }
        poVar8 = std::operator<<(poVar9,(string *)&(*pptVar18)->name_);
        poVar8 = std::operator<<(poVar8,"(");
        poVar8 = std::operator<<(poVar8,(string *)&dval);
        std::operator<<(poVar8,")");
        std::__cxx11::string::~string((string *)&dval);
        bVar3 = true;
      }
    }
    poVar8 = std::operator<<(poVar9," {");
    ptVar19 = this;
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    for (pptVar15 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        pptVar15 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar15 = pptVar15 + 1) {
      ptVar10 = t_type::get_true_type((*pptVar15)->type_);
      iVar7 = (*(ptVar10->super_t_doc)._vptr_t_doc[5])(ptVar10);
      if ((char)iVar7 == '\0') {
        ptVar11 = (*pptVar15)->value_;
        if (ptVar11 != (t_const_value *)0x0) {
          std::__cxx11::string::string((string *)&local_70,(string *)&(*pptVar15)->name_);
          print_const_value(this,poVar9,&local_70,ptVar10,ptVar11);
          std::__cxx11::string::~string((string *)&local_70);
        }
      }
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,poVar9);
    std::__cxx11::string::~string((string *)&args_indent);
    std::__cxx11::string::~string((string *)&isSet);
    ptVar21 = tstruct;
  }
  std::__cxx11::string::string((string *)&isSet,"final",(allocator *)&args_indent);
  iVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&(tstruct->super_t_type).annotations_._M_t,&isSet);
  poVar8 = poVar9;
  std::__cxx11::string::~string((string *)&isSet);
  if ((_Rb_tree_header *)iVar12._M_node ==
      &(tstruct->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header) {
    poVar9 = std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&isSet,(t_generator *)this);
    poVar9 = std::operator<<(poVar9,(string *)&isSet);
    poVar9 = std::operator<<(poVar9,"virtual ~");
    iVar7 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar9 = std::operator<<(poVar9,(string *)CONCAT44(extraout_var_12,iVar7));
    poVar9 = std::operator<<(poVar9,"() noexcept;");
    std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&isSet);
  }
  for (pptVar15 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      pptVar15 !=
      (ptVar21->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar15 = pptVar15 + 1) {
    poVar9 = poVar8;
    ptVar14 = ptVar19;
    (*(ptVar19->super_t_oop_generator).super_t_generator._vptr_t_generator[0x21])
              (ptVar19,poVar8,*pptVar15);
    poVar13 = t_generator::indent((t_generator *)ptVar19,poVar8);
    ptVar16 = *pptVar15;
    if (pointers) {
      iVar7 = (*(ptVar16->type_->super_t_doc)._vptr_t_doc[0xc])();
      bVar5 = (byte)iVar7 ^ 1;
      poVar8 = poVar9;
      ptVar19 = ptVar14;
    }
    else {
      bVar5 = false;
      poVar8 = poVar9;
      ptVar19 = ptVar14;
    }
    declare_field_abi_cxx11_(&isSet,ptVar19,ptVar16,false,(bool)bVar5,!read,false);
    poVar9 = std::operator<<(poVar13,(string *)&isSet);
    std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&isSet);
  }
  if (bVar6) {
    poVar9 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&isSet,(t_generator *)ptVar19);
    poVar9 = std::operator<<(poVar9,(string *)&isSet);
    poVar9 = std::operator<<(poVar9,"_");
    iVar7 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar9 = std::operator<<(poVar9,(string *)CONCAT44(extraout_var_13,iVar7));
    poVar9 = std::operator<<(poVar9,"__isset __isset;");
    std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&isSet);
  }
  for (pptVar15 = (ptVar21->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      pptVar15 !=
      (ptVar21->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar15 = pptVar15 + 1) {
    if (!pointers) {
      if ((*pptVar15)->reference_ == true) {
        poVar9 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&isSet,(t_generator *)ptVar19);
        poVar9 = std::operator<<(poVar9,(string *)&isSet);
        poVar9 = std::operator<<(poVar9,"void __set_");
        poVar9 = std::operator<<(poVar9,(string *)&(*pptVar15)->name_);
        poVar9 = std::operator<<(poVar9,"(::std::shared_ptr<");
        type_name_abi_cxx11_(&args_indent,ptVar19,(*pptVar15)->type_,false,false);
        poVar9 = std::operator<<(poVar9,(string *)&args_indent);
        std::operator<<(poVar9,">");
      }
      else {
        poVar9 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&isSet,(t_generator *)ptVar19);
        poVar9 = std::operator<<(poVar9,(string *)&isSet);
        poVar9 = std::operator<<(poVar9,"void __set_");
        poVar9 = std::operator<<(poVar9,(string *)&(*pptVar15)->name_);
        poVar9 = std::operator<<(poVar9,"(");
        type_name_abi_cxx11_(&args_indent,ptVar19,(*pptVar15)->type_,false,true);
        std::operator<<(poVar9,(string *)&args_indent);
      }
      std::__cxx11::string::~string((string *)&args_indent);
      std::__cxx11::string::~string((string *)&isSet);
      poVar9 = std::operator<<(poVar8," val);");
      std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    }
  }
  poVar9 = poVar8;
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  if ((!pointers) && (ptVar19->gen_no_default_operators_ == false)) {
    ptVar14 = ptVar19;
    t_generator::indent_abi_cxx11_(&isSet,(t_generator *)ptVar19);
    poVar13 = std::operator<<(poVar8,(string *)&isSet);
    poVar13 = std::operator<<(poVar13,"bool operator == (const ");
    iVar7 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar13 = std::operator<<(poVar13,(string *)CONCAT44(extraout_var_14,iVar7));
    poVar13 = std::operator<<(poVar13," & ");
    pcVar17 = "rhs";
    if ((ptVar21->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (ptVar21->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pcVar17 = "/* rhs */";
    }
    poVar13 = std::operator<<(poVar13,pcVar17);
    poVar13 = std::operator<<(poVar13,") const");
    std::operator<<(poVar13,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&isSet);
    t_oop_generator::scope_up(&ptVar19->super_t_oop_generator,poVar8);
    poVar8 = poVar9;
    ptVar19 = ptVar14;
    for (pptVar15 = (ptVar21->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        pptVar15 !=
        (ptVar21->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar15 = pptVar15 + 1) {
      if ((*pptVar15)->req_ == T_OPTIONAL) {
        t_generator::indent_abi_cxx11_(&isSet,(t_generator *)ptVar19);
        poVar9 = std::operator<<(poVar8,(string *)&isSet);
        poVar9 = std::operator<<(poVar9,"if (__isset.");
        poVar9 = std::operator<<(poVar9,(string *)&(*pptVar15)->name_);
        poVar9 = std::operator<<(poVar9," != rhs.__isset.");
        poVar9 = std::operator<<(poVar9,(string *)&(*pptVar15)->name_);
        poVar9 = std::operator<<(poVar9,")");
        poVar9 = std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&args_indent,(t_generator *)ptVar19);
        poVar9 = std::operator<<(poVar9,(string *)&args_indent);
        poVar9 = std::operator<<(poVar9,"  return false;");
        poVar9 = std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&dval,(t_generator *)ptVar19);
        poVar9 = std::operator<<(poVar9,(string *)&dval);
        poVar9 = std::operator<<(poVar9,"else if (__isset.");
        poVar9 = std::operator<<(poVar9,(string *)&(*pptVar15)->name_);
        poVar9 = std::operator<<(poVar9," && !(");
        poVar9 = std::operator<<(poVar9,(string *)&(*pptVar15)->name_);
        poVar9 = std::operator<<(poVar9," == rhs.");
        poVar9 = std::operator<<(poVar9,(string *)&(*pptVar15)->name_);
        poVar9 = std::operator<<(poVar9,"))");
        poVar9 = std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)ptVar19);
        poVar9 = std::operator<<(poVar9,(string *)&local_d0);
        poVar9 = std::operator<<(poVar9,"  return false;");
        std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&dval);
      }
      else {
        t_generator::indent_abi_cxx11_(&isSet,(t_generator *)ptVar19);
        poVar9 = std::operator<<(poVar8,(string *)&isSet);
        poVar9 = std::operator<<(poVar9,"if (!(");
        poVar9 = std::operator<<(poVar9,(string *)&(*pptVar15)->name_);
        poVar9 = std::operator<<(poVar9," == rhs.");
        poVar9 = std::operator<<(poVar9,(string *)&(*pptVar15)->name_);
        poVar9 = std::operator<<(poVar9,"))");
        poVar9 = std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&args_indent,(t_generator *)ptVar19);
        poVar9 = std::operator<<(poVar9,(string *)&args_indent);
        poVar9 = std::operator<<(poVar9,"  return false;");
        std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
      }
      std::__cxx11::string::~string((string *)&args_indent);
      std::__cxx11::string::~string((string *)&isSet);
    }
    poVar9 = t_generator::indent((t_generator *)ptVar19,poVar8);
    poVar9 = std::operator<<(poVar9,"return true;");
    std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_down(&ptVar19->super_t_oop_generator,poVar8);
    t_generator::indent_abi_cxx11_(&isSet,(t_generator *)ptVar19);
    poVar9 = std::operator<<(poVar8,(string *)&isSet);
    poVar9 = std::operator<<(poVar9,"bool operator != (const ");
    iVar7 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar9 = std::operator<<(poVar9,(string *)CONCAT44(extraout_var_15,iVar7));
    poVar9 = std::operator<<(poVar9," &rhs) const {");
    poVar9 = std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&args_indent,(t_generator *)ptVar19);
    poVar9 = std::operator<<(poVar9,(string *)&args_indent);
    poVar9 = std::operator<<(poVar9,"  return !(*this == rhs);");
    poVar9 = std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&dval,(t_generator *)ptVar19);
    poVar9 = std::operator<<(poVar9,(string *)&dval);
    poVar9 = std::operator<<(poVar9,"}");
    poVar9 = std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&dval);
    std::__cxx11::string::~string((string *)&args_indent);
    std::__cxx11::string::~string((string *)&isSet);
    t_generator::indent_abi_cxx11_(&isSet,(t_generator *)ptVar19);
    poVar9 = std::operator<<(poVar8,(string *)&isSet);
    poVar9 = std::operator<<(poVar9,"bool operator < (const ");
    iVar7 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar9 = std::operator<<(poVar9,(string *)CONCAT44(extraout_var_16,iVar7));
    poVar9 = std::operator<<(poVar9," & ) const;");
    poVar9 = std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&isSet);
  }
  if (read) {
    if (ptVar19->gen_templates_ == true) {
      t_generator::indent_abi_cxx11_(&isSet,(t_generator *)ptVar19);
      poVar9 = std::operator<<(poVar8,(string *)&isSet);
      poVar9 = std::operator<<(poVar9,"template <class Protocol_>");
      poVar9 = std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&args_indent,(t_generator *)ptVar19);
      poVar9 = std::operator<<(poVar9,(string *)&args_indent);
      poVar9 = std::operator<<(poVar9,"uint32_t read(Protocol_* iprot);");
      std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&args_indent);
      std::__cxx11::string::~string((string *)&isSet);
    }
    else {
      t_generator::indent_abi_cxx11_(&isSet,(t_generator *)ptVar19);
      poVar9 = std::operator<<(poVar8,(string *)&isSet);
      poVar9 = std::operator<<(poVar9,"uint32_t read(");
      std::operator<<(poVar9,"::apache::thrift::protocol::TProtocol* iprot)");
      std::__cxx11::string::~string((string *)&isSet);
      if ((!is_exception) && (extends._M_string_length != 0)) {
        std::operator<<(poVar8," override");
      }
      poVar9 = std::operator<<(poVar8,';');
      std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    }
  }
  if (write) {
    if (ptVar19->gen_templates_ == true) {
      t_generator::indent_abi_cxx11_(&isSet,(t_generator *)ptVar19);
      poVar9 = std::operator<<(poVar8,(string *)&isSet);
      poVar9 = std::operator<<(poVar9,"template <class Protocol_>");
      poVar9 = std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&args_indent,(t_generator *)ptVar19);
      poVar9 = std::operator<<(poVar9,(string *)&args_indent);
      poVar9 = std::operator<<(poVar9,"uint32_t write(Protocol_* oprot) const;");
      std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&args_indent);
      std::__cxx11::string::~string((string *)&isSet);
    }
    else {
      t_generator::indent_abi_cxx11_(&isSet,(t_generator *)ptVar19);
      poVar9 = std::operator<<(poVar8,(string *)&isSet);
      poVar9 = std::operator<<(poVar9,"uint32_t write(");
      std::operator<<(poVar9,"::apache::thrift::protocol::TProtocol* oprot) const");
      std::__cxx11::string::~string((string *)&isSet);
      if ((!is_exception) && (extends._M_string_length != 0)) {
        std::operator<<(poVar8," override");
      }
      poVar9 = std::operator<<(poVar8,';');
      std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    }
  }
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  if ((is_user_struct) && (bVar6 = has_custom_ostream(ptVar19,&ptVar21->super_t_type), !bVar6)) {
    t_generator::indent_abi_cxx11_(&isSet,(t_generator *)ptVar19);
    poVar9 = std::operator<<(poVar8,(string *)&isSet);
    std::operator<<(poVar9,"virtual ");
    ptVar14 = (t_cpp_generator *)&isSet;
    std::__cxx11::string::~string((string *)ptVar14);
    generate_struct_print_method_decl(ptVar14,poVar8,(t_struct *)0x0);
    poVar9 = std::operator<<(poVar8,";");
    std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
  }
  if (is_exception) {
    t_generator::indent_abi_cxx11_(&isSet,(t_generator *)ptVar19);
    poVar9 = std::operator<<(poVar8,(string *)&isSet);
    poVar9 = std::operator<<(poVar9,"mutable std::string thriftTExceptionMessageHolder_;");
    std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&isSet);
    t_generator::indent_abi_cxx11_(&isSet,(t_generator *)ptVar19);
    std::operator<<(poVar8,(string *)&isSet);
    ptVar14 = (t_cpp_generator *)&isSet;
    std::__cxx11::string::~string((string *)ptVar14);
    generate_exception_what_method_decl(ptVar14,poVar8,ptVar21,false);
    poVar9 = std::operator<<(poVar8,";");
    std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
  }
  piVar1 = &(ptVar19->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar9 = t_generator::indent((t_generator *)ptVar19,poVar8);
  poVar9 = std::operator<<(poVar9,"};");
  ptVar14 = (t_cpp_generator *)std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)ptVar14,(string *)&::endl_abi_cxx11_);
  if (!swap) goto LAB_0016f664;
  iVar7 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])();
  bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(extraout_var_17,iVar7),"a");
  if (bVar6) {
LAB_0016f51b:
    t_generator::indent_abi_cxx11_(&isSet,(t_generator *)ptVar19);
    poVar9 = std::operator<<(poVar8,(string *)&isSet);
    poVar9 = std::operator<<(poVar9,"void swap(");
    iVar7 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar9 = std::operator<<(poVar9,(string *)CONCAT44(extraout_var_19,iVar7));
    poVar9 = std::operator<<(poVar9," &a1, ");
    iVar7 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar9 = std::operator<<(poVar9,(string *)CONCAT44(extraout_var_20,iVar7));
    poVar9 = std::operator<<(poVar9," &a2);");
    poVar9 = std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
  }
  else {
    iVar7 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])();
    bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var_18,iVar7),"b");
    if (bVar6) goto LAB_0016f51b;
    t_generator::indent_abi_cxx11_(&isSet,(t_generator *)ptVar19);
    poVar9 = std::operator<<(poVar8,(string *)&isSet);
    poVar9 = std::operator<<(poVar9,"void swap(");
    iVar7 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar9 = std::operator<<(poVar9,(string *)CONCAT44(extraout_var_21,iVar7));
    poVar9 = std::operator<<(poVar9," &a, ");
    iVar7 = (*(ptVar21->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar9 = std::operator<<(poVar9,(string *)CONCAT44(extraout_var_22,iVar7));
    poVar9 = std::operator<<(poVar9," &b);");
    poVar9 = std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
  }
  ptVar14 = (t_cpp_generator *)&isSet;
  std::__cxx11::string::~string((string *)ptVar14);
LAB_0016f664:
  if (is_user_struct) {
    generate_struct_ostream_operator_decl(ptVar14,poVar8,ptVar21);
  }
  std::__cxx11::string::~string((string *)&extends);
  return;
}

Assistant:

void t_cpp_generator::generate_struct_declaration(ostream& out,
                                                  t_struct* tstruct,
                                                  bool is_exception,
                                                  bool pointers,
                                                  bool read,
                                                  bool write,
                                                  bool swap,
                                                  bool is_user_struct) {
  string extends = "";
  if (is_exception) {
    extends = " : public ::apache::thrift::TException";
  } else {
    if (is_user_struct && !gen_templates_) {
      extends = " : public virtual ::apache::thrift::TBase";
    }
  }

  // Get members
  vector<t_field*>::const_iterator m_iter;
  const vector<t_field*>& members = tstruct->get_members();

  // Write the isset structure declaration outside the class. This makes
  // the generated code amenable to processing by SWIG.
  // We only declare the struct if it gets used in the class.

  // Isset struct has boolean fields, but only for non-required fields.
  bool has_nonrequired_fields = false;
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    if ((*m_iter)->get_req() != t_field::T_REQUIRED)
      has_nonrequired_fields = true;
  }

  if (has_nonrequired_fields && (!pointers || read)) {

    out << indent() << "typedef struct _" << tstruct->get_name() << "__isset {" << endl;
    indent_up();

    indent(out) << "_" << tstruct->get_name() << "__isset() ";
    bool first = true;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if ((*m_iter)->get_req() == t_field::T_REQUIRED) {
        continue;
      }
      string isSet = ((*m_iter)->get_value() != nullptr) ? "true" : "false";
      if (first) {
        first = false;
        out << ": " << (*m_iter)->get_name() << "(" << isSet << ")";
      } else {
        out << ", " << (*m_iter)->get_name() << "(" << isSet << ")";
      }
    }
    out << " {}" << endl;

    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if ((*m_iter)->get_req() != t_field::T_REQUIRED) {
        indent(out) << "bool " << (*m_iter)->get_name() << " :1;" << endl;
      }
    }

    indent_down();
    indent(out) << "} _" << tstruct->get_name() << "__isset;" << endl;
  }

  out << endl;

  generate_java_doc(out, tstruct);

  // Open struct def
  out << indent() << "class " << tstruct->get_name() << extends << " {" << endl << indent()
      << " public:" << endl << endl;
  indent_up();

  if (!pointers) {
    bool ok_noexcept = is_struct_storage_not_throwing(tstruct);
    // Copy constructor
    indent(out) << tstruct->get_name() << "(const " << tstruct->get_name() << "&)"
                << (ok_noexcept? " noexcept" : "") << ';' << endl;

    // Move constructor
    if (gen_moveable_) {
      indent(out) << tstruct->get_name() << "(" << tstruct->get_name() << "&&) noexcept;" 
                  << endl;
    }

    // Assignment Operator
    indent(out) << tstruct->get_name() << "& operator=(const " << tstruct->get_name() << "&)"
                << (ok_noexcept? " noexcept" : "") << ';' << endl;

    // Move assignment operator
    if (gen_moveable_) {
      indent(out) << tstruct->get_name() << "& operator=(" << tstruct->get_name() << "&&) noexcept;" 
                  << endl;
    }

    bool has_default_value = false;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      t_type* t = get_true_type((*m_iter)->get_type());
      if (is_reference(*m_iter) || t->is_string()) {
        t_const_value* cv = (*m_iter)->get_value();
        if (cv != nullptr) {
          has_default_value = true;
          break;
        }
      }
    }

    // Default constructor
    std::string clsname_ctor = tstruct->get_name() + "()";
    indent(out) << clsname_ctor << (has_default_value ? "" : " noexcept");

    bool init_ctor = false;
    std::string args_indent(
      indent().size() + clsname_ctor.size() + (has_default_value ? 3 : -1), ' ');

    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      t_type* t = get_true_type((*m_iter)->get_type());
      if (t->is_base_type() || t->is_enum() || is_reference(*m_iter)) {
        string dval;
        t_const_value* cv = (*m_iter)->get_value();
        if (cv != nullptr) {
          dval += render_const_value(out, (*m_iter)->get_name(), t, cv);
        } else if (t->is_enum()) {
          dval += "static_cast<" + type_name(t) + ">(0)";
        } else {
          dval += (t->is_string() || is_reference(*m_iter)) ? "" : "0";
        }
        if (!init_ctor) {
          init_ctor = true;
          if(has_default_value) {
            out << " : ";
          } else {
            out << '\n' << args_indent << ": ";
            args_indent.append("  ");
          }
        } else {
          out << ",\n" << args_indent;
        }
        out << (*m_iter)->get_name() << "(" << dval << ")";
      }
    }
    out << " {" << endl;
    indent_up();
    // TODO(dreiss): When everything else in Thrift is perfect,
    // do more of these in the initializer list.
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      t_type* t = get_true_type((*m_iter)->get_type());

      if (!t->is_base_type()) {
        t_const_value* cv = (*m_iter)->get_value();
        if (cv != nullptr) {
          print_const_value(out, (*m_iter)->get_name(), t, cv);
        }
      }
    }
    scope_down(out);
  }

  if (tstruct->annotations_.find("final") == tstruct->annotations_.end()) {
    out << endl << indent() << "virtual ~" << tstruct->get_name() << "() noexcept;" << endl;
  }

  // Declare all fields
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
	generate_java_doc(out, *m_iter);
    indent(out) << declare_field(*m_iter,
                                 false,
                                 (pointers && !(*m_iter)->get_type()->is_xception()),
                                 !read) << endl;
  }

  // Add the __isset data member if we need it, using the definition from above
  if (has_nonrequired_fields && (!pointers || read)) {
    out << endl << indent() << "_" << tstruct->get_name() << "__isset __isset;" << endl;
  }

  // Create a setter function for each field
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    if (pointers) {
      continue;
    }
    if (is_reference((*m_iter))) {
      out << endl << indent() << "void __set_" << (*m_iter)->get_name() << "(::std::shared_ptr<"
          << type_name((*m_iter)->get_type(), false, false) << ">";
      out << " val);" << endl;
    } else {
      out << endl << indent() << "void __set_" << (*m_iter)->get_name() << "("
          << type_name((*m_iter)->get_type(), false, true);
      out << " val);" << endl;
    }
  }
  out << endl;

  if (!pointers) {
    // Should we generate default operators?
    if (!gen_no_default_operators_) {
      // Generate an equality testing operator.  Make it inline since the compiler
      // will do a better job than we would when deciding whether to inline it.
      out << indent() << "bool operator == (const " << tstruct->get_name() << " & "
          << (members.size() > 0 ? "rhs" : "/* rhs */") << ") const" << endl;
      scope_up(out);
      for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
        // Most existing Thrift code does not use isset or optional/required,
        // so we treat "default" fields as required.
        if ((*m_iter)->get_req() != t_field::T_OPTIONAL) {
          out << indent() << "if (!(" << (*m_iter)->get_name() << " == rhs."
              << (*m_iter)->get_name() << "))" << endl << indent() << "  return false;" << endl;
        } else {
          out << indent() << "if (__isset." << (*m_iter)->get_name() << " != rhs.__isset."
              << (*m_iter)->get_name() << ")" << endl << indent() << "  return false;" << endl
              << indent() << "else if (__isset." << (*m_iter)->get_name() << " && !("
              << (*m_iter)->get_name() << " == rhs." << (*m_iter)->get_name() << "))" << endl
              << indent() << "  return false;" << endl;
        }
      }
      indent(out) << "return true;" << endl;
      scope_down(out);
      out << indent() << "bool operator != (const " << tstruct->get_name() << " &rhs) const {"
          << endl << indent() << "  return !(*this == rhs);" << endl << indent() << "}" << endl
          << endl;

      // Generate the declaration of a less-than operator.  This must be
      // implemented by the application developer if they wish to use it.  (They
      // will get a link error if they try to use it without an implementation.)
      out << indent() << "bool operator < (const " << tstruct->get_name() << " & ) const;" << endl
          << endl;
    }
  }

  if (read) {
    if (gen_templates_) {
      out << indent() << "template <class Protocol_>" << endl << indent()
          << "uint32_t read(Protocol_* iprot);" << endl;
    } else {
      out << indent() << "uint32_t read("
          << "::apache::thrift::protocol::TProtocol* iprot)";
      if(!is_exception && !extends.empty())
        out << " override";
      out << ';' << endl;
    }
  }
  if (write) {
    if (gen_templates_) {
      out << indent() << "template <class Protocol_>" << endl << indent()
          << "uint32_t write(Protocol_* oprot) const;" << endl;
    } else {
      out << indent() << "uint32_t write("
          << "::apache::thrift::protocol::TProtocol* oprot) const";
      if(!is_exception && !extends.empty())
        out << " override";
      out << ';' << endl;
    }
  }
  out << endl;

  if (is_user_struct && !has_custom_ostream(tstruct)) {
    out << indent() << "virtual ";
    generate_struct_print_method_decl(out, nullptr);
    out << ";" << endl;
  }

  // std::exception::what()
  if (is_exception) {
    out << indent() << "mutable std::string thriftTExceptionMessageHolder_;" << endl;
    out << indent();
    generate_exception_what_method_decl(out, tstruct, false);
    out << ";" << endl;
  }

  indent_down();
  indent(out) << "};" << endl << endl;

  if (swap) {
    // Generate a namespace-scope swap() function
    if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
      out << indent() << "void swap(" << tstruct->get_name() << " &a1, " << tstruct->get_name()
          << " &a2);" << endl << endl;
    } else {
       out << indent() << "void swap(" << tstruct->get_name() << " &a, " << tstruct->get_name()
           << " &b);" << endl << endl;
    }
  }

  if (is_user_struct) {
    generate_struct_ostream_operator_decl(out, tstruct);
  }
}